

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformAccessLogger::getLocation
          (UniformAccessLogger *this,string *name)

{
  GLuint GVar1;
  glGetUniformLocationFunc p_Var2;
  bool bVar3;
  GLint GVar4;
  deBool dVar5;
  GLchar *pGVar6;
  TestError *this_00;
  mapped_type_conflict *pmVar7;
  iterator iStack_28;
  int loc;
  _Self local_20;
  string *local_18;
  string *name_local;
  UniformAccessLogger *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->m_uniformLocations,name);
  iStack_28 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::end(&this->m_uniformLocations);
  bVar3 = std::operator==(&local_20,&stack0xffffffffffffffd8);
  if (bVar3) {
    p_Var2 = this->m_gl->getUniformLocation;
    GVar1 = this->m_programGL;
    pGVar6 = (GLchar *)std::__cxx11::string::c_str();
    GVar4 = (*p_Var2)(GVar1,pGVar6);
    do {
      dVar5 = ::deGetFalse();
      if ((dVar5 != 0) || (GVar4 == -1)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"loc != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                   ,0x226);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->m_uniformLocations,local_18);
    *pmVar7 = GVar4;
  }
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->m_uniformLocations,local_18);
  return *pmVar7;
}

Assistant:

int UniformAccessLogger::getLocation (const string& name)
{
	if (m_uniformLocations.find(name) == m_uniformLocations.end())
	{
		const int loc = m_gl.getUniformLocation(m_programGL, name.c_str());
		TCU_CHECK(loc != -1);
		m_uniformLocations[name] = loc;
	}
	return m_uniformLocations[name];
}